

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::clausePrimitive(SelectionCompiler *this)

{
  uint uVar1;
  pointer pTVar2;
  bool bVar3;
  Token local_48;
  Token local_30;
  
  pTVar2 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (this->itokenInfix !=
      ((long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) * -0x5555555555555555) {
    uVar1 = pTVar2[this->itokenInfix].tok;
    if ((int)uVar1 < 0x409) {
      if ((int)uVar1 < 0x400) {
        if (uVar1 == 1) {
LAB_0025a94e:
          bVar3 = clauseChemObjName(this);
          return bVar3;
        }
        if (uVar1 == 2) {
          bVar3 = clauseIndex(this);
          return bVar3;
        }
      }
      else {
        if (uVar1 == 0x400) {
          tokenNext(&local_30,this);
          if (local_30.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_30.value._M_manager)(_Op_destroy,&local_30.value,(_Arg *)0x0);
            local_30.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          bVar3 = clauseOr(this);
          if (!bVar3) {
            return false;
          }
          tokenNext(&local_48,this);
          if (local_48.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_48.value._M_manager)(_Op_destroy,&local_48.value,(_Arg *)0x0);
          }
          if (local_48.tok == 0x401) {
            return true;
          }
          bVar3 = rightParenthesisExpected(this);
          return bVar3;
        }
        if (uVar1 == 0x407) goto LAB_0025a94e;
      }
    }
    else if ((int)uVar1 < 0x140c) {
      if (uVar1 - 0x409 < 2) goto LAB_0025aa24;
      if (uVar1 == 0x1406) {
        bVar3 = clauseWithin(this);
        return bVar3;
      }
    }
    else {
      if (uVar1 == 0x140c) goto LAB_0025aa24;
      if (uVar1 == 0x140d) {
        bVar3 = clauseAlphaHull(this);
        return bVar3;
      }
    }
    if ((~uVar1 & 0x1c00) == 0) {
      bVar3 = clauseComparator(this);
      return bVar3;
    }
    if ((~uVar1 & 0x4400) == 0) {
LAB_0025aa24:
      tokenNext(&local_48,this);
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&local_48);
      if (local_48.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_48.value._M_manager)(_Op_destroy,&local_48.value,(_Arg *)0x0);
      }
      return true;
    }
  }
  bVar3 = unrecognizedExpressionToken(this);
  return bVar3;
}

Assistant:

bool SelectionCompiler::clausePrimitive() {
    int tok = tokPeek();
    switch (tok) {
    case Token::within:
      return clauseWithin();

    case Token::alphahull:
      return clauseAlphaHull();

    case Token::asterisk:
    case Token::identifier:
      return clauseChemObjName();

    case Token::integer:
      return clauseIndex();
    default:
      if ((tok & Token::atomproperty) == Token::atomproperty) {
        return clauseComparator();
      }
      if ((tok & Token::predefinedset) != Token::predefinedset) { break; }
      // fall into the code and below and just add the token
      [[fallthrough]];
    case Token::all:
    case Token::none:
    case Token::hull:
      return addTokenToPostfix(tokenNext());
    case Token::leftparen:
      tokenNext();
      if (!clauseOr()) { return false; }
      if (tokenNext().tok != Token::rightparen) {
        return rightParenthesisExpected();
      }
      return true;
    }
    return unrecognizedExpressionToken();
  }